

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EquivalentTypeSet.cpp
# Opt level: O0

bool Js::EquivalentTypeSet::IsSubsetOf(EquivalentTypeSet *left,EquivalentTypeSet *right)

{
  JITTypeHolderBase<Memory::Recycler> *pJVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  JITTypeHolderBase<Memory::Recycler> **ppJVar5;
  undefined4 *puVar6;
  int local_28;
  uint uStack_24;
  bool found;
  int i;
  int j;
  EquivalentTypeSet *right_local;
  EquivalentTypeSet *left_local;
  
  bVar3 = GetSortedAndDuplicatesRemoved(left);
  if (!bVar3) {
    SortAndRemoveDuplicates(left);
  }
  bVar3 = GetSortedAndDuplicatesRemoved(right);
  if (!bVar3) {
    SortAndRemoveDuplicates(right);
  }
  if (right->count < left->count) {
    left_local._7_1_ = false;
  }
  else {
    uStack_24 = 0;
    for (local_28 = 0; local_28 < (int)(uint)left->count; local_28 = local_28 + 1) {
      bVar3 = false;
      for (; (int)uStack_24 < (int)(uint)right->count; uStack_24 = uStack_24 + 1) {
        ppJVar5 = Memory::WriteBarrierPtr::operator_cast_to_JITTypeHolderBase__
                            ((WriteBarrierPtr *)&left->types);
        pJVar1 = *ppJVar5;
        ppJVar5 = Memory::WriteBarrierPtr::operator_cast_to_JITTypeHolderBase__
                            ((WriteBarrierPtr *)&right->types);
        bVar4 = JITTypeHolderBase<Memory::Recycler>::operator<
                          (pJVar1 + local_28,*ppJVar5 + (int)uStack_24);
        if (bVar4) {
          return false;
        }
        ppJVar5 = Memory::WriteBarrierPtr::operator_cast_to_JITTypeHolderBase__
                            ((WriteBarrierPtr *)&left->types);
        pJVar1 = *ppJVar5;
        ppJVar5 = Memory::WriteBarrierPtr::operator_cast_to_JITTypeHolderBase__
                            ((WriteBarrierPtr *)&right->types);
        bVar4 = JITTypeHolderBase<Memory::Recycler>::operator==
                          (pJVar1 + local_28,*ppJVar5 + (int)uStack_24);
        if (bVar4) {
          bVar3 = true;
          uStack_24 = uStack_24 + 1;
          break;
        }
      }
      if ((int)(uint)right->count < (int)uStack_24) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/EquivalentTypeSet.cpp"
                                    ,0x77,"(j <= right->count)","j <= right->count");
        if (!bVar4) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      if ((uStack_24 == right->count) && (!bVar3)) {
        return false;
      }
    }
    left_local._7_1_ = true;
  }
  return left_local._7_1_;
}

Assistant:

bool EquivalentTypeSet::IsSubsetOf(EquivalentTypeSet * left, EquivalentTypeSet * right)
{
    if (!left->GetSortedAndDuplicatesRemoved())
    {
        left->SortAndRemoveDuplicates();
    }
    if (!right->GetSortedAndDuplicatesRemoved())
    {
        right->SortAndRemoveDuplicates();
    }

    if (left->count > right->count)
    {
        return false;
    }

    // Try to find each left type in the right set.
    int j = 0;
    for (int i = 0; i < left->count; i++)
    {
        bool found = false;
        for (; j < right->count; j++)
        {
            if (left->types[i] < right->types[j])
            {
                // Didn't find the left type. Fail.
                return false;
            }
            if (left->types[i] == right->types[j])
            {
                // Found the left type. Continue to the next left/right pair.
                found = true;
                j++;
                break;
            }
        }
        Assert(j <= right->count);
        if (j == right->count && !found)
        {
            // Exhausted the right set without finding the current left type.
            return false;
        }
    }
    return true;
}